

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O0

simple_token * simple_token_new_parent(simple_token *child,unsigned_short type)

{
  simple_token *t;
  simple_token *psStack_18;
  unsigned_short type_local;
  simple_token *child_local;
  
  if (child == (simple_token *)0x0) {
    child_local = simple_token_new(type,0,0);
  }
  else {
    child_local = simple_token_new(type,child->start,0);
    child_local->child = child;
    child->prev = (simple_token *)0x0;
    if (child == (simple_token *)0x0) {
      child_local->len = 0;
    }
    else {
      psStack_18 = child;
      if (child->next == (simple_token *)0x0) {
        child_local->len = child->len;
      }
      else {
        for (; psStack_18->next != (simple_token *)0x0; psStack_18 = psStack_18->next) {
        }
        child_local->len = (psStack_18->start + psStack_18->len) - child_local->start;
      }
    }
  }
  return child_local;
}

Assistant:

simple_token * simple_token_new_parent(simple_token * child, unsigned short type) {
	if (child == NULL) {
		return simple_token_new(type, 0, 0);
	}

	simple_token * t = simple_token_new(type, child->start, 0);
	t->child = child;
	child->prev = NULL;

	// Ensure that parent length correctly includes children
	if (child == NULL) {
		t->len = 0;
	} else if (child->next == NULL) {
		t->len = child->len;
	} else {
		while (child->next != NULL) {
			child = child->next;
		}

		t->len = child->start + child->len - t->start;
	}

	return t;
}